

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::build(Heap<Gluco::Solver::VarOrderLt> *this,vec<int> *ns)

{
  int iVar1;
  int *piVar2;
  int local_1c;
  int i;
  vec<int> *ns_local;
  Heap<Gluco::Solver::VarOrderLt> *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = vec<int>::size(&this->heap);
    if (iVar1 <= local_1c) break;
    piVar2 = vec<int>::operator[](&this->heap,local_1c);
    piVar2 = vec<int>::operator[](&this->indices,*piVar2);
    *piVar2 = -1;
    local_1c = local_1c + 1;
  }
  vec<int>::clear(&this->heap,false);
  local_1c = 0;
  while( true ) {
    iVar1 = vec<int>::size(ns);
    if (iVar1 <= local_1c) break;
    piVar2 = vec<int>::operator[](ns,local_1c);
    piVar2 = vec<int>::operator[](&this->indices,*piVar2);
    *piVar2 = local_1c;
    piVar2 = vec<int>::operator[](ns,local_1c);
    vec<int>::push(&this->heap,piVar2);
    local_1c = local_1c + 1;
  }
  local_1c = vec<int>::size(&this->heap);
  local_1c = local_1c / 2;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    percolateDown(this,local_1c);
  }
  return;
}

Assistant:

void build(vec<int>& ns) {
        int i;
        for (i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear();

        for (i = 0; i < ns.size(); i++){
            indices[ns[i]] = i;
            heap.push(ns[i]); }

        for (i = heap.size() / 2 - 1; i >= 0; i--)
            percolateDown(i);
    }